

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O2

void __thiscall
TI::TMS::CharacterFetcher<(TI::TMS::Personality)0>::CharacterFetcher
          (CharacterFetcher<(TI::TMS::Personality)0> *this,Base<(TI::TMS::Personality)0> *base,
          uint8_t y)

{
  ushort uVar1;
  ScreenMode SVar2;
  ushort uVar3;
  ushort uVar4;
  undefined7 in_register_00000011;
  
  this->base = base;
  this->y = y;
  this->row_base =
       ((ushort)CONCAT71(in_register_00000011,y) & 0xfff8) * 4 - 0x400 & base->pattern_name_address_
  ;
  uVar1 = base->colour_table_address_;
  uVar4 = base->pattern_generator_table_address_;
  this->colour_name_shift = 6;
  SVar2 = base->fetch_line_buffer_->screen_mode;
  if ((SVar2 == YamahaGraphics3) || (SVar2 == Graphics)) {
    uVar3 = (ushort)(((uint)CONCAT71(in_register_00000011,y) & 0xc0) << 5) | 0xe000;
    uVar4 = uVar4 & uVar3;
    this->colour_base = uVar1 & uVar3 | (ushort)(y & 7);
    this->colour_name_shift = 0;
  }
  else {
    this->colour_base = uVar1 & 0xffc0;
    uVar4 = uVar4 & 0xf800;
    if (SVar2 == MultiColour) {
      uVar4 = uVar4 | y >> 2 & 7;
      goto LAB_00184205;
    }
  }
  uVar4 = (y & 7) + uVar4;
LAB_00184205:
  this->pattern_base = uVar4;
  return;
}

Assistant:

CharacterFetcher(Base<personality> *base, uint8_t y) :
		base(base),
		y(y),
		row_base(base->pattern_name_address_ & bits<10>(AddressT((y << 2)&~31)))
	{
		pattern_base = base->pattern_generator_table_address_;
		colour_base = base->colour_table_address_;
		colour_name_shift = 6;

		const ScreenMode mode = base->fetch_line_buffer_->screen_mode;
		if(mode == ScreenMode::Graphics || mode == ScreenMode::YamahaGraphics3) {
			// If this is high resolution mode, allow the row number to affect the pattern and colour addresses.
			pattern_base &= bits<13>(AddressT(((y & 0xc0) << 5)));
			colour_base &= bits<13>(AddressT(((y & 0xc0) << 5)));

			colour_base += AddressT(y & 7);
			colour_name_shift = 0;
		} else {
			colour_base &= bits<6, AddressT>();
			pattern_base &= bits<11, AddressT>();
		}

		if(mode == ScreenMode::MultiColour) {
			pattern_base += AddressT((y >> 2) & 7);
		} else {
			pattern_base += AddressT(y & 7);
		}
	}